

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall
TCMallocTest_OperatorsNewOOMs_Test::~TCMallocTest_OperatorsNewOOMs_Test
          (TCMallocTest_OperatorsNewOOMs_Test *this)

{
  TCMallocTest_OperatorsNewOOMs_Test *this_local;
  
  ~TCMallocTest_OperatorsNewOOMs_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TCMallocTest, OperatorsNewOOMs) {
  printf("Testing operator new(nothrow).\n");
  TestNothrowNew(&::operator new);
  printf("Testing operator new[](nothrow).\n");
  TestNothrowNew(&::operator new[]);
  printf("Testing operator new.\n");
  TestNew(&::operator new);
  printf("Testing operator new[].\n");
  TestNew(&::operator new[]);
}